

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_comm_spawn_multiple_
               (MPIABI_Fint *count,char **array_of_commands,char ***array_of_argv,
               int *array_of_maxprocs,MPIABI_Fint *array_of_info,MPIABI_Fint *root,MPIABI_Fint *comm
               ,MPIABI_Fint *intercomm,int *array_of_errcodes,MPIABI_Fint *ierror,
               size_t arrray_of_commands_len,size_t arrray_of_argv_len)

{
  mpi_comm_spawn_multiple_();
  return;
}

Assistant:

void mpiabi_comm_spawn_multiple_(
  const MPIABI_Fint * count,
  char ** array_of_commands,
  char *** array_of_argv,
  const int * array_of_maxprocs,
  const MPIABI_Fint * array_of_info,
  const MPIABI_Fint * root,
  const MPIABI_Fint * comm,
  MPIABI_Fint * intercomm,
  int * array_of_errcodes,
  MPIABI_Fint * ierror,
  size_t arrray_of_commands_len,
  size_t arrray_of_argv_len
) {
  return mpi_comm_spawn_multiple_(
    count,
    array_of_commands,
    array_of_argv,
    array_of_maxprocs,
    array_of_info,
    root,
    comm,
    intercomm,
    array_of_errcodes,
    ierror,
    arrray_of_commands_len,
    arrray_of_argv_len
  );
}